

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cpp
# Opt level: O1

string * __thiscall
sqlcheck::GetBooleanString_abi_cxx11_(string *__return_storage_ptr__,sqlcheck *this,bool *status)

{
  sqlcheck sVar1;
  char *pcVar2;
  char *pcVar3;
  
  sVar1 = *this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (sVar1 == (sqlcheck)0x1) {
    pcVar3 = "ENABLED";
    pcVar2 = "";
  }
  else {
    pcVar3 = "DISABLED";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string GetBooleanString(const bool& status){
  if(status == true){
    return "ENABLED";
  }
  else {
    return "DISABLED";
  }
}